

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfunc.h
# Opt level: O0

bool rapidjson::internal::CountStringCodePoint<rapidjson::UTF8<char>>
               (Ch *s,SizeType length,SizeType *outCount)

{
  bool bVar1;
  uint local_48;
  int local_44;
  uint codepoint;
  SizeType count;
  Ch *end;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  SizeType *outCount_local;
  SizeType length_local;
  Ch *s_local;
  
  is.head_ = (Ch *)outCount;
  if (s == (Ch *)0x0) {
    __assert_fail("s != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                  ,0x41,
                  "bool rapidjson::internal::CountStringCodePoint(const typename Encoding::Ch *, SizeType, SizeType *) [Encoding = rapidjson::UTF8<>]"
                 );
  }
  if (outCount != (SizeType *)0x0) {
    GenericStringStream<rapidjson::UTF8<char>_>::GenericStringStream
              ((GenericStringStream<rapidjson::UTF8<char>_> *)&end,s);
    _codepoint = s + length;
    local_44 = 0;
    while( true ) {
      if (_codepoint <= end) {
        *(int *)is.head_ = local_44;
        return true;
      }
      bVar1 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        ((GenericStringStream<rapidjson::UTF8<char>_> *)&end,&local_48);
      if (!bVar1) break;
      local_44 = local_44 + 1;
    }
    return false;
  }
  __assert_fail("outCount != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                ,0x42,
                "bool rapidjson::internal::CountStringCodePoint(const typename Encoding::Ch *, SizeType, SizeType *) [Encoding = rapidjson::UTF8<>]"
               );
}

Assistant:

bool CountStringCodePoint(const typename Encoding::Ch* s, SizeType length, SizeType* outCount) {
    RAPIDJSON_ASSERT(s != 0);
    RAPIDJSON_ASSERT(outCount != 0);
    GenericStringStream<Encoding> is(s);
    const typename Encoding::Ch* end = s + length;
    SizeType count = 0;
    while (is.src_ < end) {
        unsigned codepoint;
        if (!Encoding::Decode(is, &codepoint))
            return false;
        count++;
    }
    *outCount = count;
    return true;
}